

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaHeat2D_kry.c
# Opt level: O0

int resHeat(sunrealtype tt,N_Vector uu,N_Vector up,N_Vector rr,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  UserData data;
  sunrealtype dif2;
  sunrealtype dif1;
  sunrealtype coeff;
  sunrealtype *rr_data;
  sunrealtype *up_data;
  sunrealtype *uu_data;
  sunindextype mm;
  sunindextype loc;
  sunindextype offset;
  sunindextype j;
  sunindextype i;
  long local_38;
  long local_30;
  
  lVar5 = N_VGetArrayPointer(in_RDI);
  lVar6 = N_VGetArrayPointer(in_RSI);
  lVar7 = N_VGetArrayPointer(in_RDX);
  dVar1 = (double)in_RCX[2];
  lVar4 = *in_RCX;
  N_VScale(0x3ff0000000000000,in_RDI,in_RDX);
  for (local_38 = 1; local_38 < 9; local_38 = local_38 + 1) {
    for (local_30 = 1; local_30 < lVar4 + -1; local_30 = local_30 + 1) {
      lVar8 = lVar4 * local_38 + local_30;
      dVar2 = *(double *)(lVar5 + lVar8 * 8);
      dVar3 = *(double *)(lVar5 + lVar8 * 8);
      *(double *)(lVar7 + lVar8 * 8) =
           -dVar1 * (((*(double *)(lVar5 + (lVar8 + -1) * 8) + *(double *)(lVar5 + 8 + lVar8 * 8)) -
                     (dVar2 + dVar2)) +
                    ((*(double *)(lVar5 + (lVar8 - lVar4) * 8) +
                     *(double *)(lVar5 + (lVar8 + lVar4) * 8)) - (dVar3 + dVar3))) +
           *(double *)(lVar6 + lVar8 * 8);
    }
  }
  return 0;
}

Assistant:

int resHeat(sunrealtype tt, N_Vector uu, N_Vector up, N_Vector rr, void* user_data)
{
  sunindextype i, j, offset, loc, mm;
  sunrealtype *uu_data, *up_data, *rr_data, coeff, dif1, dif2;
  UserData data;

  uu_data = N_VGetArrayPointer(uu);
  up_data = N_VGetArrayPointer(up);
  rr_data = N_VGetArrayPointer(rr);

  data = (UserData)user_data;

  coeff = data->coeff;
  mm    = data->mm;

  /* Initialize rr to uu, to take care of boundary equations. */
  N_VScale(ONE, uu, rr);

  /* Loop over interior points; set res = up - (central difference). */
  for (j = 1; j < MGRID - 1; j++)
  {
    offset = mm * j;
    for (i = 1; i < mm - 1; i++)
    {
      loc          = offset + i;
      dif1         = uu_data[loc - 1] + uu_data[loc + 1] - TWO * uu_data[loc];
      dif2         = uu_data[loc - mm] + uu_data[loc + mm] - TWO * uu_data[loc];
      rr_data[loc] = up_data[loc] - coeff * (dif1 + dif2);
    }
  }

  return (0);
}